

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_enclosed_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id,bool register_expression_read)

{
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  undefined1 local_40 [43];
  bool register_expression_read_local;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  local_40._36_4_ = (undefined4)CONCAT71(in_register_00000011,register_expression_read);
  local_40[0x23] = in_CL & 1;
  unique0x1000005b = (Variant *)CONCAT44(in_register_00000034,id);
  this_local = this;
  to_expression_abi_cxx11_((CompilerGLSL *)local_40,id,register_expression_read);
  enclose_expression(this,(string *)CONCAT44(in_register_00000034,id));
  ::std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

string CompilerGLSL::to_enclosed_expression(uint32_t id, bool register_expression_read)
{
	return enclose_expression(to_expression(id, register_expression_read));
}